

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_helper.c
# Opt level: O0

void riscv_cpu_do_interrupt_riscv64(CPUState *cs)

{
  TranslationBlock *pTVar1;
  _Bool _Var2;
  int iVar3;
  CPURISCVState_conflict1 *env_00;
  bool bVar4;
  long local_f8;
  ulong local_d8;
  long local_b8;
  ulong local_a0;
  TranslationBlock *local_80;
  TranslationBlock *local_70;
  target_ulong hdeleg;
  target_ulong mtval2;
  target_ulong htval;
  target_ulong tval;
  target_ulong deleg;
  target_ulong cause;
  _Bool async;
  target_ulong s;
  _Bool force_hs_execp;
  CPURISCVState_conflict1 *env;
  RISCVCPU_conflict *cpu;
  CPUState *cs_local;
  
  env_00 = (CPURISCVState_conflict1 *)(cs[1].tb_jmp_cache + 0x143);
  s._7_1_ = riscv_cpu_force_hs_excep_enabled_riscv64(env_00);
  bVar4 = (cs->exception_index & 0x80000000U) != 0;
  deleg = (target_ulong)(int)(cs->exception_index & 0x7fffffff);
  if (bVar4) {
    local_70 = cs[1].tb_jmp_cache[0x195];
  }
  else {
    local_70 = cs[1].tb_jmp_cache[0x19a];
  }
  htval = 0;
  mtval2 = 0;
  hdeleg = 0;
  if (bVar4) goto LAB_011bad13;
  if ((((deleg < 2) || (deleg - 4 < 4)) || (deleg - 0xc < 2)) || (deleg == 0xf)) {
LAB_011bac42:
    htval = (target_ulong)cs[1].tb_jmp_cache[0x187];
  }
  else if ((deleg - 0x14 < 2) || (deleg == 0x17)) {
    s._7_1_ = true;
    goto LAB_011bac42;
  }
  if (deleg == 8) {
    if ((TranslationBlock *)0x3 < cs[1].tb_jmp_cache[0x18d]) {
      __assert_fail("env->priv <= 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/riscv/cpu_helper.c"
                    ,0x35d,"void riscv_cpu_do_interrupt_riscv64(CPUState *)");
    }
    if (cs[1].tb_jmp_cache[0x18d] == (TranslationBlock *)0x3) {
      deleg = 0xb;
    }
    else if ((cs[1].tb_jmp_cache[0x18d] == (TranslationBlock *)&DAT_00000001) &&
            (_Var2 = riscv_cpu_virt_enabled_riscv64(env_00), _Var2)) {
      deleg = 10;
    }
    else if ((cs[1].tb_jmp_cache[0x18d] != (TranslationBlock *)&DAT_00000001) ||
            (_Var2 = riscv_cpu_virt_enabled_riscv64(env_00), _Var2)) {
      if (cs[1].tb_jmp_cache[0x18d] == (TranslationBlock *)0x0) {
        deleg = 8;
      }
    }
    else {
      deleg = 9;
    }
  }
LAB_011bad13:
  if ((((TranslationBlock *)&DAT_00000001 < cs[1].tb_jmp_cache[0x18d]) || (0x3f < deleg)) ||
     (((ulong)local_70 >> ((byte)deleg & 0x3f) & 1) == 0)) {
    iVar3 = riscv_has_ext(env_00,0x80);
    if (iVar3 != 0) {
      _Var2 = riscv_cpu_virt_enabled_riscv64(env_00);
      if (_Var2) {
        riscv_cpu_swap_hypervisor_regs_riscv64(env_00);
      }
      pTVar1 = cs[1].tb_jmp_cache[0x191];
      _Var2 = riscv_cpu_virt_enabled_riscv64(env_00);
      cs[1].tb_jmp_cache[0x191] =
           (TranslationBlock *)((ulong)pTVar1 & 0xffffff7fffffffff | (ulong)_Var2 << 0x27);
      pTVar1 = cs[1].tb_jmp_cache[0x191];
      _Var2 = riscv_cpu_force_hs_excep_enabled_riscv64(env_00);
      cs[1].tb_jmp_cache[0x191] =
           (TranslationBlock *)((ulong)pTVar1 & 0xffffffbfffffffff | (ulong)_Var2 << 0x26);
      hdeleg = (target_ulong)cs[1].tb_jmp_cache[0x188];
      riscv_cpu_set_virt_enabled_riscv64(env_00,false);
      riscv_cpu_set_force_hs_excep_riscv64(env_00,false);
    }
    pTVar1 = cs[1].tb_jmp_cache[0x191];
    if (cs[1].tb_jmp_cache[0x189] < (TranslationBlock *)0x11000) {
      local_d8 = ((ulong)pTVar1 & (long)(1 << ((byte)cs[1].tb_jmp_cache[0x18d] & 0x1f))) /
                 (ulong)(long)(int)(1 << ((byte)cs[1].tb_jmp_cache[0x18d] & 0x1f) &
                                   ((1 << ((byte)cs[1].tb_jmp_cache[0x18d] & 0x1f)) << 1 ^
                                   0xffffffffU));
    }
    else {
      local_d8 = ((ulong)pTVar1 & 8) >> 3;
    }
    cs[1].tb_jmp_cache[0x191] =
         (TranslationBlock *)
         ((ulong)pTVar1 & 0xffffffffffffe777 | (local_d8 & 1) << 7 |
         ((ulong)cs[1].tb_jmp_cache[0x18d] & 3) << 0xb);
    cs[1].tb_jmp_cache[0x1a0] =
         (TranslationBlock *)(deleg | 0xffffffffffffffffU >> bVar4 ^ 0xffffffffffffffff);
    cs[1].tb_jmp_cache[0x19f] = cs[1].tb_jmp_cache[0x183];
    cs[1].tb_jmp_cache[0x199] = (TranslationBlock *)htval;
    cs[1].tb_jmp_cache[0x1b1] = (TranslationBlock *)hdeleg;
    if ((bVar4) && (((ulong)cs[1].tb_jmp_cache[0x19e] & 3) == 1)) {
      local_f8 = deleg << 2;
    }
    else {
      local_f8 = 0;
    }
    cs[1].tb_jmp_cache[0x183] =
         (TranslationBlock *)(((ulong)cs[1].tb_jmp_cache[0x19e] & 0xfffffffffffffffc) + local_f8);
    riscv_cpu_set_mode_riscv64(env_00,3);
  }
  else {
    iVar3 = riscv_has_ext(env_00,0x80);
    if (iVar3 != 0) {
      if (bVar4) {
        local_80 = cs[1].tb_jmp_cache[0x1a4];
      }
      else {
        local_80 = cs[1].tb_jmp_cache[0x1a3];
      }
      _Var2 = riscv_cpu_virt_enabled_riscv64(env_00);
      if (((_Var2) && (((ulong)local_80 >> ((byte)deleg & 0x3f) & 1) != 0)) && (s._7_1_ == false)) {
        if (((deleg == 6) || (deleg == 2)) || (deleg == 10)) {
          deleg = deleg - 1;
        }
      }
      else {
        _Var2 = riscv_cpu_virt_enabled_riscv64(env_00);
        if (_Var2) {
          riscv_cpu_swap_hypervisor_regs_riscv64(env_00);
          cs[1].tb_jmp_cache[0x1a2] =
               (TranslationBlock *)
               ((ulong)cs[1].tb_jmp_cache[0x1a2] & 0xfffffffffffffdff |
               (((ulong)cs[1].tb_jmp_cache[0x1a2] & 0x80) >> 7) << 9);
          cs[1].tb_jmp_cache[0x1a2] =
               (TranslationBlock *)
               ((ulong)cs[1].tb_jmp_cache[0x1a2] & 0xfffffffffffffeff |
               (ulong)cs[1].tb_jmp_cache[0x191] & 0x100);
          pTVar1 = cs[1].tb_jmp_cache[0x1a2];
          _Var2 = riscv_cpu_virt_enabled_riscv64(env_00);
          cs[1].tb_jmp_cache[0x1a2] =
               (TranslationBlock *)((ulong)pTVar1 & 0xffffffffffffff7f | (ulong)_Var2 << 7);
          mtval2 = (target_ulong)cs[1].tb_jmp_cache[0x188];
          riscv_cpu_set_virt_enabled_riscv64(env_00,false);
          riscv_cpu_set_force_hs_excep_riscv64(env_00,false);
        }
        else {
          cs[1].tb_jmp_cache[0x1a2] =
               (TranslationBlock *)
               ((ulong)cs[1].tb_jmp_cache[0x1a2] & 0xfffffffffffffdff |
               (((ulong)cs[1].tb_jmp_cache[0x1a2] & 0x80) >> 7) << 9);
          cs[1].tb_jmp_cache[0x1a2] =
               (TranslationBlock *)
               ((ulong)cs[1].tb_jmp_cache[0x1a2] & 0xfffffffffffffeff |
               (ulong)cs[1].tb_jmp_cache[0x191] & 0x100);
          pTVar1 = cs[1].tb_jmp_cache[0x1a2];
          _Var2 = riscv_cpu_virt_enabled_riscv64(env_00);
          cs[1].tb_jmp_cache[0x1a2] =
               (TranslationBlock *)((ulong)pTVar1 & 0xffffffffffffff7f | (ulong)_Var2 << 7);
          mtval2 = (target_ulong)cs[1].tb_jmp_cache[0x188];
        }
      }
    }
    pTVar1 = cs[1].tb_jmp_cache[0x191];
    if (cs[1].tb_jmp_cache[0x189] < (TranslationBlock *)0x11000) {
      local_a0 = ((ulong)pTVar1 & (long)(1 << ((byte)cs[1].tb_jmp_cache[0x18d] & 0x1f))) /
                 (ulong)(long)(int)(1 << ((byte)cs[1].tb_jmp_cache[0x18d] & 0x1f) &
                                   ((1 << ((byte)cs[1].tb_jmp_cache[0x18d] & 0x1f)) << 1 ^
                                   0xffffffffU));
    }
    else {
      local_a0 = ((ulong)pTVar1 & 2) >> 1;
    }
    cs[1].tb_jmp_cache[0x191] =
         (TranslationBlock *)
         ((ulong)pTVar1 & 0xfffffffffffffedd | (local_a0 & 1) << 5 |
         ((ulong)cs[1].tb_jmp_cache[0x18d] & 1) << 8);
    cs[1].tb_jmp_cache[0x19d] = (TranslationBlock *)(deleg | (ulong)bVar4 << 0x3f);
    cs[1].tb_jmp_cache[0x19c] = cs[1].tb_jmp_cache[0x183];
    cs[1].tb_jmp_cache[0x198] = (TranslationBlock *)htval;
    cs[1].tb_jmp_cache[0x1a6] = (TranslationBlock *)mtval2;
    if ((bVar4) && (((ulong)cs[1].tb_jmp_cache[0x19b] & 3) == 1)) {
      local_b8 = deleg << 2;
    }
    else {
      local_b8 = 0;
    }
    cs[1].tb_jmp_cache[0x183] =
         (TranslationBlock *)(((ulong)cs[1].tb_jmp_cache[0x19b] & 0xfffffffffffffffc) + local_b8);
    riscv_cpu_set_mode_riscv64(env_00,1);
  }
  cs->exception_index = -1;
  return;
}

Assistant:

void riscv_cpu_do_interrupt(CPUState *cs)
{
    RISCVCPU *cpu = RISCV_CPU(cs);
    CPURISCVState *env = &cpu->env;
    bool force_hs_execp = riscv_cpu_force_hs_excep_enabled(env);
    target_ulong s;

    /* cs->exception is 32-bits wide unlike mcause which is XLEN-bits wide
     * so we mask off the MSB and separate into trap type and cause.
     */
    bool async = !!(cs->exception_index & RISCV_EXCP_INT_FLAG);
    target_ulong cause = cs->exception_index & RISCV_EXCP_INT_MASK;
    target_ulong deleg = async ? env->mideleg : env->medeleg;
    target_ulong tval = 0;
    target_ulong htval = 0;
    target_ulong mtval2 = 0;

    if (!async) {
        /* set tval to badaddr for traps with address information */
        switch (cause) {
        case RISCV_EXCP_INST_GUEST_PAGE_FAULT:
        case RISCV_EXCP_LOAD_GUEST_ACCESS_FAULT:
        case RISCV_EXCP_STORE_GUEST_AMO_ACCESS_FAULT:
            force_hs_execp = true;
            /* fallthrough */
        case RISCV_EXCP_INST_ADDR_MIS:
        case RISCV_EXCP_INST_ACCESS_FAULT:
        case RISCV_EXCP_LOAD_ADDR_MIS:
        case RISCV_EXCP_STORE_AMO_ADDR_MIS:
        case RISCV_EXCP_LOAD_ACCESS_FAULT:
        case RISCV_EXCP_STORE_AMO_ACCESS_FAULT:
        case RISCV_EXCP_INST_PAGE_FAULT:
        case RISCV_EXCP_LOAD_PAGE_FAULT:
        case RISCV_EXCP_STORE_PAGE_FAULT:
            tval = env->badaddr;
            break;
        default:
            break;
        }
        /* ecall is dispatched as one cause so translate based on mode */
        if (cause == RISCV_EXCP_U_ECALL) {
            assert(env->priv <= 3);

            if (env->priv == PRV_M) {
                cause = RISCV_EXCP_M_ECALL;
            } else if (env->priv == PRV_S && riscv_cpu_virt_enabled(env)) {
                cause = RISCV_EXCP_VS_ECALL;
            } else if (env->priv == PRV_S && !riscv_cpu_virt_enabled(env)) {
                cause = RISCV_EXCP_S_ECALL;
            } else if (env->priv == PRV_U) {
                cause = RISCV_EXCP_U_ECALL;
            }
        }
    }

    if (env->priv <= PRV_S &&
            cause < TARGET_LONG_BITS && ((deleg >> cause) & 1)) {
        /* handle the trap in S-mode */
        if (riscv_has_ext(env, RVH)) {
            target_ulong hdeleg = async ? env->hideleg : env->hedeleg;

            if (riscv_cpu_virt_enabled(env) && ((hdeleg >> cause) & 1) &&
                !force_hs_execp) {
                /*
                 * See if we need to adjust cause. Yes if its VS mode interrupt
                 * no if hypervisor has delegated one of hs mode's interrupt
                 */
                if (cause == IRQ_VS_TIMER || cause == IRQ_VS_SOFT ||
                    cause == IRQ_VS_EXT)
                    cause = cause - 1;
                /* Trap to VS mode */
            } else if (riscv_cpu_virt_enabled(env)) {
                /* Trap into HS mode, from virt */
                riscv_cpu_swap_hypervisor_regs(env);
                env->hstatus = set_field(env->hstatus, HSTATUS_SP2V,
                                         get_field(env->hstatus, HSTATUS_SPV));
                env->hstatus = set_field(env->hstatus, HSTATUS_SP2P,
                                         get_field(env->mstatus, SSTATUS_SPP));
                env->hstatus = set_field(env->hstatus, HSTATUS_SPV,
                                         riscv_cpu_virt_enabled(env));

                htval = env->guest_phys_fault_addr;

                riscv_cpu_set_virt_enabled(env, 0);
                riscv_cpu_set_force_hs_excep(env, 0);
            } else {
                /* Trap into HS mode */
                env->hstatus = set_field(env->hstatus, HSTATUS_SP2V,
                                         get_field(env->hstatus, HSTATUS_SPV));
                env->hstatus = set_field(env->hstatus, HSTATUS_SP2P,
                                         get_field(env->mstatus, SSTATUS_SPP));
                env->hstatus = set_field(env->hstatus, HSTATUS_SPV,
                                         riscv_cpu_virt_enabled(env));

                htval = env->guest_phys_fault_addr;
            }
        }

        s = env->mstatus;
        s = set_field(s, MSTATUS_SPIE, env->priv_ver >= PRIV_VERSION_1_10_0 ?
            get_field(s, MSTATUS_SIE) : get_field(s, MSTATUS_UIE << env->priv));
        s = set_field(s, MSTATUS_SPP, env->priv);
        s = set_field(s, MSTATUS_SIE, 0);
        env->mstatus = s;
        env->scause = cause | ((target_ulong)async << (TARGET_LONG_BITS - 1));
        env->sepc = env->pc;
        env->sbadaddr = tval;
        env->htval = htval;
        env->pc = (env->stvec >> 2 << 2) +
            ((async && (env->stvec & 3) == 1) ? cause * 4 : 0);
        riscv_cpu_set_mode(env, PRV_S);
    } else {
        /* handle the trap in M-mode */
        if (riscv_has_ext(env, RVH)) {
            if (riscv_cpu_virt_enabled(env)) {
                riscv_cpu_swap_hypervisor_regs(env);
            }
#ifdef TARGET_RISCV32
            env->mstatush = set_field(env->mstatush, MSTATUS_MPV,
                                       riscv_cpu_virt_enabled(env));
            env->mstatush = set_field(env->mstatush, MSTATUS_MTL,
                                       riscv_cpu_force_hs_excep_enabled(env));
#else
            env->mstatus = set_field(env->mstatus, MSTATUS_MPV,
                                      riscv_cpu_virt_enabled(env));
            env->mstatus = set_field(env->mstatus, MSTATUS_MTL,
                                      riscv_cpu_force_hs_excep_enabled(env));
#endif

            mtval2 = env->guest_phys_fault_addr;

            /* Trapping to M mode, virt is disabled */
            riscv_cpu_set_virt_enabled(env, 0);
            riscv_cpu_set_force_hs_excep(env, 0);
        }

        s = env->mstatus;
        s = set_field(s, MSTATUS_MPIE, env->priv_ver >= PRIV_VERSION_1_10_0 ?
            get_field(s, MSTATUS_MIE) : get_field(s, MSTATUS_UIE << env->priv));
        s = set_field(s, MSTATUS_MPP, env->priv);
        s = set_field(s, MSTATUS_MIE, 0);
        env->mstatus = s;
        env->mcause = cause | ~(((target_ulong)-1) >> async);
        env->mepc = env->pc;
        env->mbadaddr = tval;
        env->mtval2 = mtval2;
        env->pc = (env->mtvec >> 2 << 2) +
            ((async && (env->mtvec & 3) == 1) ? cause * 4 : 0);
        riscv_cpu_set_mode(env, PRV_M);
    }

    /* NOTE: it is not necessary to yield load reservations here. It is only
     * necessary for an SC from "another hart" to cause a load reservation
     * to be yielded. Refer to the memory consistency model section of the
     * RISC-V ISA Specification.
     */

    cs->exception_index = EXCP_NONE; /* mark handled to qemu */
}